

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compress.cpp
# Opt level: O0

int main(void)

{
  string_t local_78;
  undefined1 local_58 [8];
  buffer_t compressed;
  allocator<char> local_29;
  undefined1 local_28 [8];
  string input;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_28,
             "this is a string that I want to compress into a smaller\nstring. Just to make sure there is enough data in the\ncompression buffer, I\'m going to fill this string with a\ndecent amount of content. Let\'s hope this works.\n"
             ,&local_29);
  std::allocator<char>::~allocator(&local_29);
  std::__cxx11::string::string
            ((string *)&local_78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28);
  zstdpp::compress((buffer_t *)local_58,&local_78,'\x16');
  std::__cxx11::string::~string((string *)&local_78);
  print_compress_result((string *)local_28,(buffer_t *)local_58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  std::__cxx11::string::~string((string *)local_28);
  return 0;
}

Assistant:

int main() {
  std::string input("this is a string that I want to compress into a smaller\n"
                    "string. Just to make sure there is enough data in the\n"
                    "compression buffer, I'm going to fill this string with a\n"
                    "decent amount of content. Let's hope this works.\n");

  auto compressed = zstdpp::compress(input, 22);
  print_compress_result(input, compressed);
}